

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_fold.c
# Opt level: O1

int32_t kfold_intop(int32_t k1,int32_t k2,IROp op)

{
  byte bVar1;
  int32_t iVar2;
  
  bVar1 = (byte)k2;
  switch(op) {
  case IR_BAND:
    k1 = k1 & k2;
    break;
  case IR_BOR:
    k1 = k1 | k2;
    break;
  case IR_BXOR:
    k1 = k1 ^ k2;
    break;
  case IR_BSHL:
    k1 = k1 << (bVar1 & 0x1f);
    break;
  case IR_BSHR:
    k1 = (uint)k1 >> (bVar1 & 0x1f);
    break;
  case IR_BSAR:
    k1 = k1 >> (bVar1 & 0x1f);
    break;
  case IR_BROL:
    k1 = k1 << (bVar1 & 0x1f) | (uint)k1 >> 0x20 - (bVar1 & 0x1f);
    break;
  case IR_BROR:
    k1 = (uint)k1 >> (bVar1 & 0x1f) | k1 << 0x20 - (bVar1 & 0x1f);
    break;
  case IR_ADD:
    k1 = k1 + k2;
    break;
  case IR_SUB:
    k1 = k1 - k2;
    break;
  case IR_MUL:
    k1 = k1 * k2;
    break;
  case IR_MOD:
    iVar2 = lj_vm_modi(k1,k2);
    return iVar2;
  case IR_NEG:
    k1 = -k1;
    break;
  case IR_MIN:
    if (k2 <= k1) {
      return k2;
    }
    return k1;
  case IR_MAX:
    if (k2 < k1) {
      k2 = k1;
    }
    return k2;
  }
  return k1;
}

Assistant:

static int32_t kfold_intop(int32_t k1, int32_t k2, IROp op)
{
  switch (op) {
  case IR_ADD: k1 += k2; break;
  case IR_SUB: k1 -= k2; break;
  case IR_MUL: k1 *= k2; break;
  case IR_MOD: k1 = lj_vm_modi(k1, k2); break;
  case IR_NEG: k1 = -k1; break;
  case IR_BAND: k1 &= k2; break;
  case IR_BOR: k1 |= k2; break;
  case IR_BXOR: k1 ^= k2; break;
  case IR_BSHL: k1 <<= (k2 & 31); break;
  case IR_BSHR: k1 = (int32_t)((uint32_t)k1 >> (k2 & 31)); break;
  case IR_BSAR: k1 >>= (k2 & 31); break;
  case IR_BROL: k1 = (int32_t)lj_rol((uint32_t)k1, (k2 & 31)); break;
  case IR_BROR: k1 = (int32_t)lj_ror((uint32_t)k1, (k2 & 31)); break;
  case IR_MIN: k1 = k1 < k2 ? k1 : k2; break;
  case IR_MAX: k1 = k1 > k2 ? k1 : k2; break;
  default: lj_assertX(0, "bad IR op %d", op); break;
  }
  return k1;
}